

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SPIRVShaderResources.cpp
# Opt level: O3

unsigned_short
Diligent::GetResourceArraySize<unsigned_short_const>(Compiler *Compiler,Resource *Res)

{
  size_t sVar1;
  SPIRType *pSVar2;
  unsigned_short *in_RCX;
  uint uVar3;
  string msg;
  char local_32 [2];
  string local_30;
  
  pSVar2 = diligent_spirv_cross::Compiler::get_type(Compiler,(TypeID)(Res->type_id).id);
  sVar1 = (pSVar2->array).super_VectorView<unsigned_int>.buffer_size;
  if (sVar1 == 0) {
    uVar3 = 1;
  }
  else {
    if (sVar1 != 1) {
      FormatString<char[52]>
                (&local_30,(char (*) [52])"Only one-dimensional arrays are currently supported");
      in_RCX = (unsigned_short *)0x32;
      DebugAssertionFailed
                (local_30._M_dataplus._M_p,"GetResourceArraySize",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/ShaderTools/src/SPIRVShaderResources.cpp"
                 ,0x32);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_30._M_dataplus._M_p != &local_30.field_2) {
        operator_delete(local_30._M_dataplus._M_p,local_30.field_2._M_allocated_capacity + 1);
      }
    }
    uVar3 = *(pSVar2->array).super_VectorView<unsigned_int>.ptr;
    if (0xffff < uVar3) {
      local_32[0] = -1;
      local_32[1] = -1;
      FormatString<char[48],unsigned_short>
                (&local_30,(Diligent *)"Array size exceeds maximum representable value ",
                 (char (*) [48])local_32,in_RCX);
      DebugAssertionFailed
                (local_30._M_dataplus._M_p,"GetResourceArraySize",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/ShaderTools/src/SPIRVShaderResources.cpp"
                 ,0x35);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_30._M_dataplus._M_p != &local_30.field_2) {
        operator_delete(local_30._M_dataplus._M_p,local_30.field_2._M_allocated_capacity + 1);
      }
    }
  }
  return (unsigned_short)uVar3;
}

Assistant:

Type GetResourceArraySize(const diligent_spirv_cross::Compiler& Compiler,
                          const diligent_spirv_cross::Resource& Res)
{
    const auto& type    = Compiler.get_type(Res.type_id);
    uint32_t    arrSize = 1;
    if (!type.array.empty())
    {
        // https://github.com/KhronosGroup/SPIRV-Cross/wiki/Reflection-API-user-guide#querying-array-types
        VERIFY(type.array.size() == 1, "Only one-dimensional arrays are currently supported");
        arrSize = type.array[0];
    }
    VERIFY(arrSize <= std::numeric_limits<Type>::max(), "Array size exceeds maximum representable value ", std::numeric_limits<Type>::max());
    return static_cast<Type>(arrSize);
}